

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_Equals_Test<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  value_type this_00;
  value_type file;
  char *expected_predicate_value;
  AssertionResult gtest_ar__12;
  int i_1;
  int i;
  AssertionResult gtest_ar__11;
  AssertionResult gtest_ar__10;
  AssertionResult gtest_ar__9;
  AssertionResult gtest_ar__8;
  AssertionResult gtest_ar__7;
  TypeParam ht3;
  Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL> alloc;
  hasher hasher;
  AssertionResult gtest_ar__6;
  AssertionResult gtest_ar__5;
  AssertionResult gtest_ar__4;
  AssertionResult gtest_ar__3;
  AssertionResult gtest_ar__2;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff7a8;
  int in_stack_fffffffffffff7ac;
  undefined4 in_stack_fffffffffffff7b0;
  int in_stack_fffffffffffff7b4;
  undefined4 uVar4;
  HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff7b8;
  value_type in_stack_fffffffffffff7c0;
  undefined4 in_stack_fffffffffffff7c8;
  int in_stack_fffffffffffff7cc;
  int line;
  hasher *in_stack_fffffffffffff7d0;
  undefined4 in_stack_fffffffffffff7d8;
  undefined2 in_stack_fffffffffffff7dc;
  undefined1 in_stack_fffffffffffff7de;
  undefined1 in_stack_fffffffffffff7df;
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  *in_stack_fffffffffffff7e0;
  char *actual_predicate_value;
  char *expression_text;
  Alloc<int,_unsigned_long,_18446744073709551615UL> *this_01;
  AssertHelper *in_stack_fffffffffffff830;
  AssertionResult local_798 [6];
  value_type local_72c;
  int local_724;
  value_type *in_stack_fffffffffffff8e8;
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff8f0;
  int local_6bc;
  string local_6b8 [55];
  undefined1 local_681;
  AssertionResult local_680 [6];
  value_type local_618;
  string local_610 [55];
  byte local_5d9;
  AssertionResult local_5d8;
  string local_5c8 [55];
  undefined1 local_591;
  AssertionResult local_590 [6];
  value_type local_528;
  string local_520 [55];
  byte local_4e9;
  AssertionResult local_4e8;
  string local_4d8 [55];
  undefined1 local_4a1;
  AssertionResult local_4a0;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_490 [11];
  Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL> local_3d8 [2];
  string local_3b8 [55];
  undefined1 local_381;
  AssertionResult local_380;
  string local_370 [55];
  byte local_339;
  AssertionResult local_338;
  string local_328 [55];
  undefined1 local_2f1;
  AssertionResult local_2f0;
  key_type local_2e0;
  string local_2d8 [55];
  byte local_2a1;
  AssertionResult local_2a0;
  string local_290 [55];
  undefined1 local_259;
  AssertionResult local_258;
  string local_248 [55];
  byte local_211;
  AssertionResult local_210;
  string local_200 [55];
  undefined1 local_1c9;
  AssertionResult local_1c8;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_1b8 [14];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_d8;
  char local_c8 [12];
  char local_bc [188];
  
  actual_predicate_value = local_bc;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             in_stack_fffffffffffff7ac);
  expression_text = local_c8;
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             in_stack_fffffffffffff7ac);
  expected_predicate_value = (char *)0x0;
  this_01 = &local_d8;
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(this_01,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff7e0,
             CONCAT17(in_stack_fffffffffffff7df,
                      CONCAT16(in_stack_fffffffffffff7de,
                               CONCAT24(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8))),
             in_stack_fffffffffffff7d0,
             (key_equal *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
             (allocator_type *)in_stack_fffffffffffff7c0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_d8);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             in_stack_fffffffffffff7ac);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             in_stack_fffffffffffff7ac);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(local_1b8,0,(int *)0x0);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff7e0,
             CONCAT17(in_stack_fffffffffffff7df,
                      CONCAT16(in_stack_fffffffffffff7de,
                               CONCAT24(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8))),
             in_stack_fffffffffffff7d0,
             (key_equal *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
             (allocator_type *)in_stack_fffffffffffff7c0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_1b8);
  local_1c9 = google::
              BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                           (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0bc06)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_1c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7e0,
               CONCAT13(in_stack_fffffffffffff7df,
                        CONCAT12(in_stack_fffffffffffff7de,in_stack_fffffffffffff7dc)),
               (char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               (char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string(local_200);
    testing::Message::~Message((Message *)0xf0bd4a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0bdde);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                       (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  local_211 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0be1c)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_210);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7e0,
               CONCAT13(in_stack_fffffffffffff7df,
                        CONCAT12(in_stack_fffffffffffff7de,in_stack_fffffffffffff7dc)),
               (char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               (char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string(local_248);
    testing::Message::~Message((Message *)0xf0bef1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0bf85);
  local_259 = google::
              BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                           (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0bfc6)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_258);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7e0,
               CONCAT13(in_stack_fffffffffffff7df,
                        CONCAT12(in_stack_fffffffffffff7de,in_stack_fffffffffffff7dc)),
               (char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               (char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string(local_290);
    testing::Message::~Message((Message *)0xf0c09b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0c12f);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                       (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  local_2a1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0c172)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7e0,
               CONCAT13(in_stack_fffffffffffff7df,
                        CONCAT12(in_stack_fffffffffffff7de,in_stack_fffffffffffff7dc)),
               (char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               (char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string(local_2d8);
    testing::Message::~Message((Message *)0xf0c247);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0c2de);
  local_2e0 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff7b8,in_stack_fffffffffffff7b4);
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                    (key_type *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  local_2f1 = google::
              BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                           (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0c359)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_2f0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7e0,
               CONCAT13(in_stack_fffffffffffff7df,
                        CONCAT12(in_stack_fffffffffffff7de,in_stack_fffffffffffff7dc)),
               (char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               (char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string(local_328);
    testing::Message::~Message((Message *)0xf0c42e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0c4c2);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                       (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  local_339 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0c505)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_338);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7e0,
               CONCAT13(in_stack_fffffffffffff7df,
                        CONCAT12(in_stack_fffffffffffff7de,in_stack_fffffffffffff7dc)),
               (char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               (char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string(local_370);
    testing::Message::~Message((Message *)0xf0c5da);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0c66e);
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::resize((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
           CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  local_381 = google::
              BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                           (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0c6c3)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_380);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7e0,
               CONCAT13(in_stack_fffffffffffff7df,
                        CONCAT12(in_stack_fffffffffffff7de,in_stack_fffffffffffff7dc)),
               (char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               (char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string(local_3b8);
    testing::Message::~Message((Message *)0xf0c798);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0c82f);
  TransparentHasher::TransparentHasher
            ((TransparentHasher *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             in_stack_fffffffffffff7ac);
  Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>::Alloc(local_3d8,2,(int *)0x0);
  Alloc<int,unsigned_long,18446744073709551615ul>::Alloc<std::pair<int,int>>
            ((Alloc<int,unsigned_long,18446744073709551615ul> *)local_490,local_3d8);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_SparseHashtable
            (in_stack_fffffffffffff7e0,
             CONCAT17(in_stack_fffffffffffff7df,
                      CONCAT16(in_stack_fffffffffffff7de,
                               CONCAT24(in_stack_fffffffffffff7dc,in_stack_fffffffffffff7d8))),
             in_stack_fffffffffffff7d0,
             (key_equal *)CONCAT44(in_stack_fffffffffffff7cc,in_stack_fffffffffffff7c8),
             (allocator_type *)in_stack_fffffffffffff7c0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(local_490);
  local_4a1 = google::
              BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                           (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0c8e7)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4a0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7e0,
               CONCAT13(in_stack_fffffffffffff7df,
                        CONCAT12(in_stack_fffffffffffff7de,in_stack_fffffffffffff7dc)),
               (char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               (char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string(local_4d8);
    testing::Message::~Message((Message *)0xf0ca14);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0caa8);
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                       (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  local_4e9 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0caeb)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_4e8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffff7e0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)in_stack_fffffffffffff7e0,
               CONCAT13(in_stack_fffffffffffff7df,
                        CONCAT12(in_stack_fffffffffffff7de,in_stack_fffffffffffff7dc)),
               (char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               (char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string(local_520);
    testing::Message::~Message((Message *)0xf0cbc0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0cc57);
  this_00 = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
            ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),0);
  local_528 = this_00;
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  uVar2 = google::
          BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator!=((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                       (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  local_591 = uVar2;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0ccda)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_590);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,
               CONCAT13(uVar2,CONCAT12(in_stack_fffffffffffff7de,in_stack_fffffffffffff7dc)),
               (char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               (char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string(local_5c8);
    testing::Message::~Message((Message *)0xf0cdaf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0ce43);
  uVar3 = google::
          BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                       (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  local_5d9 = ~uVar3 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0ce86)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_5d8);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff7dc)),
               (char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7cc,
               (char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string(local_610);
    testing::Message::~Message((Message *)0xf0cf5b);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0cff2);
  file = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),0);
  local_618 = file;
  google::
  BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  local_681 = google::
              BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                           (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  line = CONCAT13(local_681,(int3)in_stack_fffffffffffff7cc);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0d075)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_680);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff7dc)),
               (char *)file,line,(char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string(local_6b8);
    testing::Message::~Message((Message *)0xf0d14a);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0d1de);
  for (local_6bc = 3; local_6bc < 0x7d1; local_6bc = local_6bc + 1) {
    in_stack_fffffffffffff7c0 =
         HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),0);
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  }
  for (local_724 = 2000; 2 < local_724; local_724 = local_724 + -1) {
    local_72c = HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::UniqueObject((HashtableTest<google::HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                                *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),0);
    google::
    BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
    ::insert(in_stack_fffffffffffff8f0,in_stack_fffffffffffff8e8);
  }
  bVar1 = google::
          BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7b4,in_stack_fffffffffffff7b0),
                       (BaseHashtableInterface<google::sparse_hashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8));
  uVar4 = CONCAT13(bVar1,(int3)in_stack_fffffffffffff7b4);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)CONCAT44(uVar4,in_stack_fffffffffffff7b0),
             (bool *)CONCAT44(in_stack_fffffffffffff7ac,in_stack_fffffffffffff7a8),(type *)0xf0d310)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_798);
  if (!bVar1) {
    testing::Message::Message((Message *)this_00);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)this_01,expression_text,actual_predicate_value,
               expected_predicate_value);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)this_00,CONCAT13(uVar2,CONCAT12(uVar3,in_stack_fffffffffffff7dc)),
               (char *)file,line,(char *)in_stack_fffffffffffff7c0);
    testing::internal::AssertHelper::operator=(in_stack_fffffffffffff830,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper
              ((AssertHelper *)CONCAT44(uVar4,in_stack_fffffffffffff7b0));
    std::__cxx11::string::~string((string *)&stack0xfffffffffffff830);
    testing::Message::~Message((Message *)0xf0d3d3);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xf0d467);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xf0d474);
  Alloc<std::pair<int,_int>,_unsigned_long,_18446744073709551615UL>::~Alloc(local_3d8);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xf0d48e);
  google::
  HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_SparseHashtable
            ((HashtableInterface_SparseHashtable<std::pair<int,_int>,_std::pair<int,_int>,_TransparentHasher,_PairNegation<std::pair<int,_int>_>,_SetKey<std::pair<int,_int>,_PairNegation<std::pair<int,_int>_>_>,_TransparentHasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xf0d49b);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, Equals) {
  // The real test here is whether two hashtables are equal if they
  // have the same items but in a different order.
  TypeParam ht1;
  TypeParam ht2;

  EXPECT_TRUE(ht1 == ht1);
  EXPECT_FALSE(ht1 != ht1);
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.set_deleted_key(this->UniqueKey(1));
  // Only the contents affect equality, not things like deleted-key.
  EXPECT_TRUE(ht1 == ht2);
  EXPECT_FALSE(ht1 != ht2);
  ht1.resize(2000);
  EXPECT_TRUE(ht1 == ht2);

  // The choice of allocator/etc doesn't matter either.
  typename TypeParam::hasher hasher(1);
  Alloc<typename TypeParam::key_type> alloc(2, NULL);
  TypeParam ht3(5, hasher, hasher, alloc);
  EXPECT_TRUE(ht1 == ht3);
  EXPECT_FALSE(ht1 != ht3);

  ht1.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 != ht2);
  EXPECT_FALSE(ht1 == ht2);  // this should hold as well!

  ht2.insert(this->UniqueObject(2));
  EXPECT_TRUE(ht1 == ht2);

  for (int i = 3; i <= 2000; i++) {
    ht1.insert(this->UniqueObject(i));
  }
  for (int i = 2000; i >= 3; i--) {
    ht2.insert(this->UniqueObject(i));
  }
  EXPECT_TRUE(ht1 == ht2);
}